

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O3

void __thiscall QSplitter::QSplitter(QSplitter *this,Orientation orientation,QWidget *parent)

{
  long lVar1;
  QWidget *this_00;
  QFramePrivate *this_01;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  
  this_01 = (QFramePrivate *)operator_new(0x2b0);
  QFramePrivate::QFramePrivate(this_01);
  *(undefined ***)&this_01->super_QWidgetPrivate = &PTR__QSplitterPrivate_007fad20;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x8 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x10 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x18 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x20 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x2c = 0xffffffff00010101;
  *(undefined2 *)&this_01[1].super_QWidgetPrivate.field_0x34 = 0;
  QFrame::QFrame(&this->super_QFrame,this_01,parent,(WindowFlags)0x0);
  *(undefined ***)&(this->super_QFrame).super_QWidget = &PTR_metaObject_007fafd8;
  *(undefined ***)&(this->super_QFrame).super_QWidget.super_QPaintDevice = &PTR__QSplitter_007fb198;
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  *(Orientation *)(lVar1 + 0x2a0) = orientation;
  this_00 = *(QWidget **)(lVar1 + 8);
  policy.data = 0x570000;
  if (orientation == Vertical) {
    policy.data = 0x750000;
  }
  QWidget::setSizePolicy(this_00,(QSizePolicy)policy);
  QWidget::setAttribute(this_00,WA_WState_OwnSizePolicy,false);
  return;
}

Assistant:

QSplitter::QSplitter(Qt::Orientation orientation, QWidget *parent)
    : QFrame(*new QSplitterPrivate, parent)
{
    Q_D(QSplitter);
    d->orient = orientation;
    d->init();
}